

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit __thiscall
units::commoditizedUnit(units *this,string *unit_string,precise_unit actUnit,size_t *index)

{
  bool bVar1;
  uint32_t commodity_code;
  long lVar2;
  char *pcVar3;
  string local_b0;
  uint32_t local_8c;
  undefined4 local_88;
  uint32_t hcode;
  precise_unit local_78;
  undefined1 local_68 [8];
  string commodStr;
  size_type start;
  size_type ccindex;
  size_t *index_local;
  string *unit_string_local;
  precise_unit actUnit_local;
  double local_10;
  
  ccindex = actUnit._8_8_;
  unit_string_local = (string *)actUnit.multiplier_;
  index_local = (size_t *)this;
  actUnit_local.multiplier_ = (double)unit_string;
  lVar2 = std::__cxx11::string::find_first_of((char)this,0x7b);
  if (lVar2 == -1) {
    local_10 = actUnit_local.multiplier_;
    actUnit_local._8_8_ = unit_string_local;
  }
  else {
    commodStr.field_2._8_8_ = lVar2 + 1;
    start = commodStr.field_2._8_8_;
    segmentcheck((string *)index_local,'}',&start);
    if ((start - commodStr.field_2._8_8_ == 2) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)index_local), *pcVar3 == '#')) {
      *(size_type *)ccindex = start;
      join_0x00000000_0x00001200_ =
           precise_unit::operator*((precise_unit *)&unit_string_local,(unit *)&count);
    }
    else {
      std::__cxx11::string::substr((ulong)local_68,(ulong)index_local);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,"cells");
      if (bVar1) {
        *(size_type *)ccindex = start;
        precise_unit::precise_unit(&local_78,1.0,(precise_unit *)precise::count,0x604335a0);
        join_0x00000000_0x00001200_ =
             precise_unit::operator*((precise_unit *)&unit_string_local,&local_78);
      }
      else {
        std::__cxx11::string::string((string *)&local_b0,(string *)local_68);
        commodity_code = getCommodity(&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        *(size_type *)ccindex = start;
        local_8c = commodity_code;
        precise_unit::precise_unit
                  ((precise_unit *)&actUnit_local.base_units_,1.0,(precise_unit *)&unit_string_local
                   ,commodity_code);
      }
      local_88 = 1;
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static precise_unit commoditizedUnit(
    const std::string& unit_string,
    precise_unit actUnit,
    size_t& index)
{
    auto ccindex = unit_string.find_first_of('{');
    if (ccindex == std::string::npos) {
        return actUnit;
    }
    ++ccindex;
    auto start = ccindex;
    segmentcheck(unit_string, '}', ccindex);
    if (ccindex - start == 2) {
        // there are a couple units that might look like commodities
        if (unit_string[start] == '#') {
            index = ccindex;
            return actUnit * count;
        }
    }
    std::string commodStr = unit_string.substr(start, ccindex - start - 1);
    if (commodStr == "cells") {
        index = ccindex;
        return actUnit * precise_unit(1.0, precise::count, commodities::cell);
    }
    auto hcode = getCommodity(std::move(commodStr));
    index = ccindex;
    return {1.0, actUnit, hcode};
}